

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator::ImmutableEnumOneofFieldGenerator
          (ImmutableEnumOneofFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex,Context *context)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  FieldDescriptor *in_RSI;
  FieldDescriptor *in_RDI;
  ImmutableEnumFieldGenerator *unaff_retaddr;
  OneofDescriptor *in_stack_00000018;
  Context *in_stack_00000020;
  OneofGeneratorInfo *info;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000370;
  OneofGeneratorInfo *in_stack_00000378;
  FieldDescriptor *in_stack_00000380;
  
  ImmutableEnumFieldGenerator::ImmutableEnumFieldGenerator
            (unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
             (Context *)CONCAT44(in_EDX,in_ECX));
  *(undefined ***)in_RDI = &PTR__ImmutableEnumOneofFieldGenerator_00898538;
  FieldDescriptor::containing_oneof(in_RSI);
  Context::GetOneofGeneratorInfo(in_stack_00000020,in_stack_00000018);
  SetCommonOneofVariables(in_stack_00000380,in_stack_00000378,in_stack_00000370);
  return;
}

Assistant:

ImmutableEnumOneofFieldGenerator::ImmutableEnumOneofFieldGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    Context* context)
    : ImmutableEnumFieldGenerator(descriptor, messageBitIndex, builderBitIndex,
                                  context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}